

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_diag_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  int *piVar2;
  int *piVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  short sVar11;
  undefined1 auVar12 [16];
  unkbyte10 Var13;
  undefined1 auVar14 [16];
  int iVar15;
  parasail_result_t *ppVar16;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  short sVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  int16_t iVar25;
  undefined8 unaff_RBX;
  int iVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  ulong uVar42;
  ulong uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  short sVar53;
  undefined4 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  short sVar58;
  undefined1 auVar57 [16];
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  undefined1 auVar67 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar68 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ushort uVar71;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  uint local_190;
  int16_t *local_188;
  short local_178;
  short sStack_176;
  undefined1 local_148 [16];
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  ushort local_e8;
  ushort uStack_e6;
  undefined8 local_98;
  ulong uStack_90;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short sVar82;
  short sVar86;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_table_diag_sse41_128_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_table_diag_sse41_128_16_cold_6();
  }
  else if (open < 0) {
    parasail_nw_table_diag_sse41_128_16_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_table_diag_sse41_128_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_table_diag_sse41_128_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_table_diag_sse41_128_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar43 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_table_diag_sse41_128_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar43 = (ulong)(uint)matrix->length;
    }
    iVar26 = -open;
    iVar23 = matrix->min;
    iVar15 = -iVar23;
    if (iVar23 != iVar26 && SBORROW4(iVar23,iVar26) == iVar23 + open < 0) {
      iVar15 = open;
    }
    iVar23 = matrix->max;
    uVar29 = (uint)uVar43;
    ppVar16 = parasail_result_new_table1(uVar29,s2Len);
    if (ppVar16 != (parasail_result_t *)0x0) {
      ppVar16->flag = ppVar16->flag | 0x8221001;
      uVar40 = (ulong)(s2Len + 0xe);
      ptr = parasail_memalign_int16_t(0x10,uVar40);
      ptr_00 = parasail_memalign_int16_t(0x10,uVar40);
      ptr_01 = parasail_memalign_int16_t(0x10,uVar40);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (int16_t *)0x0)) {
        if (matrix->type == 0) {
          iVar41 = uVar29 + 7;
          local_188 = parasail_memalign_int16_t(0x10,(long)iVar41);
          if (local_188 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar29) {
            piVar2 = matrix->mapper;
            uVar40 = 0;
            do {
              local_188[uVar40] = (int16_t)piVar2[(byte)_s1[uVar40]];
              uVar40 = uVar40 + 1;
            } while (uVar43 != uVar40);
          }
          iVar10 = uVar29 + 1;
          if ((int)(uVar29 + 1) < iVar41) {
            iVar10 = iVar41;
          }
          memset(local_188 + (int)uVar29,0,(ulong)(~uVar29 + iVar10) * 2 + 2);
        }
        else {
          local_188 = (int16_t *)0x0;
        }
        auVar46 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar23));
        sVar11 = (short)gap;
        sVar21 = (short)iVar26;
        sVar4 = (short)open;
        uVar22 = s2Len + 7;
        uVar27 = uVar29 - 1;
        iVar23 = s2Len + -1;
        uVar38 = iVar15 - 0x7fff;
        auVar55 = pshuflw(ZEXT416(uVar38),ZEXT416(uVar38),0);
        uVar54 = auVar55._0_4_;
        local_178 = auVar55._0_2_;
        sStack_176 = auVar55._2_2_;
        auVar46 = pshuflw(auVar46,auVar46,0);
        auVar55._0_4_ = auVar46._0_4_;
        auVar55._4_4_ = auVar55._0_4_;
        auVar55._8_4_ = auVar55._0_4_;
        auVar55._12_4_ = auVar55._0_4_;
        auVar55 = pshuflw(auVar55,ZEXT416((uint)open),0);
        uVar44 = auVar55._0_4_;
        auVar55 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
        uVar45 = auVar55._0_4_;
        auVar56._4_4_ = uVar45;
        auVar56._0_4_ = uVar45;
        auVar56._8_4_ = uVar45;
        auVar56._12_4_ = uVar45;
        auVar55 = pshuflw(ZEXT416(uVar29),ZEXT416(uVar29),0);
        uVar45 = auVar55._0_4_;
        auVar50._4_4_ = uVar45;
        auVar50._0_4_ = uVar45;
        auVar50._8_4_ = uVar45;
        auVar50._12_4_ = uVar45;
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar55 = paddsw(auVar50,auVar51);
        auVar50 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
        auVar68._0_4_ = auVar50._0_4_;
        auVar68._4_4_ = auVar68._0_4_;
        auVar68._8_4_ = auVar68._0_4_;
        auVar68._12_4_ = auVar68._0_4_;
        auVar51 = paddsw(auVar68,auVar51);
        auVar50 = psllw(auVar56,3);
        local_148._10_2_ = sVar21 + sVar11 * -2;
        local_148._8_2_ = sVar11 * -3 - sVar4;
        local_148._12_2_ = sVar21 - sVar11;
        local_148._14_2_ = sVar21;
        local_148._0_8_ =
             (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
             (ulong)(ushort)(sVar11 * -6 - sVar4) << 0x10 |
             (ulong)(ushort)(sVar11 * -5 - sVar4) << 0x20 |
             (ulong)(ushort)(sVar21 + sVar11 * -4) << 0x30;
        piVar2 = matrix->mapper;
        uVar40 = 1;
        if (1 < s2Len) {
          uVar40 = (ulong)(uint)s2Len;
        }
        uVar24 = 0;
        do {
          ptr[uVar24 + 7] = (int16_t)piVar2[(byte)_s2[uVar24]];
          uVar24 = uVar24 + 1;
        } while (uVar40 != uVar24);
        uVar24 = 0;
        ptr[3] = 0;
        ptr[4] = 0;
        ptr[5] = 0;
        ptr[6] = 0;
        ptr[0] = 0;
        ptr[1] = 0;
        ptr[2] = 0;
        ptr[3] = 0;
        uVar42 = (ulong)(uint)s2Len;
        uVar30 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar22) {
          uVar30 = uVar22;
        }
        memset(ptr + uVar42 + 7,0,(ulong)(~s2Len + uVar30) * 2 + 2);
        do {
          ptr_00[uVar24 + 7] = (int16_t)iVar26;
          iVar26 = iVar26 - gap;
          iVar25 = (int16_t)uVar38;
          ptr_01[uVar24 + 7] = iVar25;
          uVar24 = uVar24 + 1;
        } while (uVar40 != uVar24);
        lVar17 = 0;
        do {
          ptr_00[lVar17] = iVar25;
          ptr_01[lVar17] = iVar25;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 7);
        lVar17 = uVar42 + 7;
        do {
          ptr_00[lVar17] = iVar25;
          ptr_01[lVar17] = iVar25;
          lVar17 = lVar17 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar22);
        ptr_00[6] = 0;
        local_e8 = auVar46._0_2_;
        uStack_e6 = auVar46._2_2_;
        uVar59 = local_e8;
        uVar60 = uStack_e6;
        uVar61 = local_e8;
        uVar62 = uStack_e6;
        uVar63 = local_e8;
        uVar64 = uStack_e6;
        uVar65 = local_e8;
        uVar66 = uStack_e6;
        if ((int)uVar29 < 1) {
          auVar46._4_2_ = local_178;
          auVar46._0_4_ = uVar54;
          auVar46._6_2_ = sStack_176;
          auVar46._8_2_ = local_178;
          auVar46._10_2_ = sStack_176;
          auVar46._12_2_ = local_178;
          auVar46._14_2_ = sStack_176;
          auVar67 = auVar46;
        }
        else {
          piVar2 = matrix->matrix;
          Var13 = CONCAT28(local_178,CONCAT26(sStack_176,CONCAT24(local_178,uVar54)));
          auVar12._10_2_ = sStack_176;
          auVar12._0_10_ = Var13;
          auVar12._12_2_ = local_178;
          auVar12._14_2_ = sStack_176;
          uVar40 = 1;
          if (1 < (int)uVar22) {
            uVar40 = (ulong)uVar22;
          }
          lVar17 = uVar42 * 0x20;
          local_100 = uVar42 * 4 + -4;
          local_110 = uVar42 * 0x1c + -0x1c;
          local_118 = uVar42 * 0x18 + -0x18;
          local_120 = uVar42 * 0x14 + -0x14;
          local_128 = uVar42 * 8 + -8;
          local_130 = uVar42 * 0x10 + -0x10;
          local_138 = uVar42 * 0xc + -0xc;
          auVar68 = pmovsxbw(in_XMM5,0x1020304050607);
          local_108 = 0;
          auVar69 = pmovsxbw(in_XMM8,0x101010101010101);
          auVar14._4_4_ = uVar44;
          auVar14._0_4_ = uVar44;
          auVar14._8_4_ = uVar44;
          auVar14._12_4_ = uVar44;
          uVar24 = 0;
          auVar46 = auVar12;
          auVar67 = auVar12;
          do {
            iVar15 = matrix->type;
            uVar22 = (uint)uVar24;
            uVar29 = uVar22;
            if (iVar15 == 0) {
              uVar29 = (uint)local_188[uVar24];
            }
            uVar18 = uVar24 | 1;
            if (iVar15 == 0) {
              uVar30 = (int)local_188[uVar18];
            }
            else {
              uVar30 = uVar27;
              if (uVar18 < uVar43) {
                uVar30 = uVar22 | 1;
              }
            }
            uVar31 = uVar24 | 2;
            if (iVar15 == 0) {
              uVar34 = (int)local_188[uVar31];
            }
            else {
              uVar34 = uVar27;
              if (uVar31 < uVar43) {
                uVar34 = uVar22 | 2;
              }
            }
            uVar37 = uVar24 | 3;
            if (iVar15 == 0) {
              uVar39 = (int)local_188[uVar37];
            }
            else {
              uVar39 = uVar27;
              if (uVar37 < uVar43) {
                uVar39 = uVar22 | 3;
              }
            }
            uVar32 = uVar24 | 4;
            if (iVar15 == 0) {
              local_190 = (int)local_188[uVar32];
            }
            else {
              local_190 = uVar27;
              if (uVar32 < uVar43) {
                local_190 = uVar22 | 4;
              }
            }
            uVar33 = uVar24 | 5;
            if (iVar15 == 0) {
              uVar35 = (int)local_188[uVar33];
            }
            else {
              uVar35 = uVar27;
              if (uVar33 < uVar43) {
                uVar35 = uVar22 | 5;
              }
            }
            uVar19 = uVar24 | 6;
            if (iVar15 == 0) {
              uVar36 = (int)local_188[uVar19];
            }
            else {
              uVar36 = uVar27;
              if (uVar19 < uVar43) {
                uVar36 = uVar22 | 6;
              }
            }
            iVar26 = matrix->size;
            uVar20 = uVar24 | 7;
            if (iVar15 == 0) {
              uVar28 = (int)local_188[uVar20];
            }
            else {
              uVar28 = uVar27;
              if (uVar20 < uVar43) {
                uVar28 = uVar22 | 7;
              }
            }
            uVar1 = uVar24 + 8;
            local_98 = (undefined8)((unkuint10)Var13 >> 0x10);
            uStack_90 = auVar12._8_8_ >> 0x10;
            auVar84._8_8_ = uStack_90 | (ulong)(ushort)ptr_00[6] << 0x30;
            auVar84._0_8_ = local_98;
            ptr_00[6] = sVar21 - (short)uVar1 * sVar11;
            auVar73._8_8_ = uStack_90 | (ulong)(ushort)(sVar21 - (short)uVar24 * sVar11) << 0x30;
            auVar73._0_8_ = local_98;
            local_78 = auVar55._0_2_;
            sStack_76 = auVar55._2_2_;
            sStack_74 = auVar55._4_2_;
            sStack_72 = auVar55._6_2_;
            sStack_70 = auVar55._8_2_;
            sStack_6e = auVar55._10_2_;
            sStack_6c = auVar55._12_2_;
            sStack_6a = auVar55._14_2_;
            auVar81._0_2_ = -(ushort)(auVar68._0_2_ == local_78);
            auVar81._2_2_ = -(ushort)(auVar68._2_2_ == sStack_76);
            auVar81._4_2_ = -(ushort)(auVar68._4_2_ == sStack_74);
            auVar81._6_2_ = -(ushort)(auVar68._6_2_ == sStack_72);
            auVar81._8_2_ = -(ushort)(auVar68._8_2_ == sStack_70);
            auVar81._10_2_ = -(ushort)(auVar68._10_2_ == sStack_6e);
            auVar81._12_2_ = -(ushort)(auVar68._12_2_ == sStack_6c);
            auVar81._14_2_ = -(ushort)(auVar68._14_2_ == sStack_6a);
            uVar24 = 0;
            in_XMM13 = pmovsxbw(in_XMM13,0xfffefdfcfbfaf9);
            auVar70._4_2_ = local_178;
            auVar70._0_4_ = uVar54;
            auVar70._6_2_ = sStack_176;
            auVar70._8_2_ = local_178;
            auVar70._10_2_ = sStack_176;
            auVar70._12_2_ = local_178;
            auVar70._14_2_ = sStack_176;
            auVar49 = auVar46;
            auVar88 = auVar70;
            do {
              auVar47._10_2_ = (short)piVar2[(long)(int)(uVar34 * iVar26) + (long)ptr[uVar24 + 5]];
              auVar47._8_2_ = (short)piVar2[(long)(int)(uVar39 * iVar26) + (long)ptr[uVar24 + 4]];
              auVar47._12_2_ = (short)piVar2[(long)(int)(uVar30 * iVar26) + (long)ptr[uVar24 + 6]];
              auVar47._14_2_ = (short)piVar2[(long)(int)(uVar29 * iVar26) + (long)ptr[uVar24 + 7]];
              auVar47._0_8_ =
                   (ulong)(uint)piVar2[(long)(int)(uVar28 * iVar26) + (long)ptr[uVar24]] &
                   0xffffffff0000ffff |
                   (ulong)*(ushort *)(piVar2 + (long)(int)(uVar36 * iVar26) + (long)ptr[uVar24 + 1])
                   << 0x10 | (ulong)*(ushort *)
                                     (piVar2 + (long)(int)(uVar35 * iVar26) + (long)ptr[uVar24 + 2])
                             << 0x20 |
                   (ulong)*(ushort *)
                           (piVar2 + (long)(int)(local_190 * iVar26) + (long)ptr[uVar24 + 3]) <<
                   0x30;
              auVar52._0_8_ = auVar73._2_8_;
              auVar52._8_8_ = auVar73._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar24 + 7] << 0x30;
              auVar83._0_8_ = auVar70._2_8_;
              auVar83._8_8_ = auVar70._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar24 + 7] << 0x30;
              auVar46 = paddsw(auVar47,auVar84);
              auVar70 = psubsw(auVar52,auVar14);
              auVar84 = psubsw(auVar83,auVar56);
              sVar4 = auVar70._0_2_;
              sVar82 = auVar84._0_2_;
              auVar85._0_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._2_2_;
              sVar82 = auVar84._2_2_;
              auVar85._2_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._4_2_;
              sVar82 = auVar84._4_2_;
              auVar85._4_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._6_2_;
              sVar82 = auVar84._6_2_;
              auVar85._6_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._8_2_;
              sVar82 = auVar84._8_2_;
              auVar85._8_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._10_2_;
              sVar82 = auVar84._10_2_;
              auVar85._10_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82
              ;
              sVar4 = auVar70._12_2_;
              sVar82 = auVar84._12_2_;
              sVar86 = auVar84._14_2_;
              auVar85._12_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82
              ;
              sVar4 = auVar70._14_2_;
              auVar85._14_2_ = (ushort)(sVar86 < sVar4) * sVar4 | (ushort)(sVar86 >= sVar4) * sVar86
              ;
              auVar70 = psubsw(auVar73,auVar14);
              auVar84 = psubsw(auVar88,auVar56);
              sVar4 = auVar70._0_2_;
              sVar82 = auVar84._0_2_;
              auVar87._0_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._2_2_;
              sVar82 = auVar84._2_2_;
              auVar87._2_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._4_2_;
              sVar82 = auVar84._4_2_;
              auVar87._4_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._6_2_;
              sVar82 = auVar84._6_2_;
              auVar87._6_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._8_2_;
              sVar82 = auVar84._8_2_;
              auVar87._8_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82;
              sVar4 = auVar70._10_2_;
              sVar82 = auVar84._10_2_;
              auVar87._10_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82
              ;
              sVar4 = auVar70._12_2_;
              sVar82 = auVar84._12_2_;
              sVar86 = auVar84._14_2_;
              auVar87._12_2_ = (ushort)(sVar82 < sVar4) * sVar4 | (ushort)(sVar82 >= sVar4) * sVar82
              ;
              sVar4 = auVar70._14_2_;
              auVar87._14_2_ = (ushort)(sVar86 < sVar4) * sVar4 | (ushort)(sVar86 >= sVar4) * sVar86
              ;
              uVar71 = ((short)auVar87._0_2_ < (short)auVar85._0_2_) * auVar85._0_2_ |
                       ((short)auVar87._0_2_ >= (short)auVar85._0_2_) * auVar87._0_2_;
              uVar74 = ((short)auVar87._2_2_ < (short)auVar85._2_2_) * auVar85._2_2_ |
                       ((short)auVar87._2_2_ >= (short)auVar85._2_2_) * auVar87._2_2_;
              uVar75 = ((short)auVar87._4_2_ < (short)auVar85._4_2_) * auVar85._4_2_ |
                       ((short)auVar87._4_2_ >= (short)auVar85._4_2_) * auVar87._4_2_;
              uVar76 = ((short)auVar87._6_2_ < (short)auVar85._6_2_) * auVar85._6_2_ |
                       ((short)auVar87._6_2_ >= (short)auVar85._6_2_) * auVar87._6_2_;
              uVar77 = ((short)auVar87._8_2_ < (short)auVar85._8_2_) * auVar85._8_2_ |
                       ((short)auVar87._8_2_ >= (short)auVar85._8_2_) * auVar87._8_2_;
              uVar78 = ((short)auVar87._10_2_ < (short)auVar85._10_2_) * auVar85._10_2_ |
                       ((short)auVar87._10_2_ >= (short)auVar85._10_2_) * auVar87._10_2_;
              uVar79 = ((short)auVar87._12_2_ < (short)auVar85._12_2_) * auVar85._12_2_ |
                       ((short)auVar87._12_2_ >= (short)auVar85._12_2_) * auVar87._12_2_;
              uVar80 = ((short)auVar87._14_2_ < (short)auVar85._14_2_) * auVar85._14_2_ |
                       ((short)auVar87._14_2_ >= (short)auVar85._14_2_) * auVar87._14_2_;
              sVar4 = auVar46._0_2_;
              auVar72._0_2_ =
                   (ushort)((short)uVar71 < sVar4) * sVar4 | ((short)uVar71 >= sVar4) * uVar71;
              sVar4 = auVar46._2_2_;
              auVar72._2_2_ =
                   (ushort)((short)uVar74 < sVar4) * sVar4 | ((short)uVar74 >= sVar4) * uVar74;
              sVar4 = auVar46._4_2_;
              auVar72._4_2_ =
                   (ushort)((short)uVar75 < sVar4) * sVar4 | ((short)uVar75 >= sVar4) * uVar75;
              sVar4 = auVar46._6_2_;
              auVar72._6_2_ =
                   (ushort)((short)uVar76 < sVar4) * sVar4 | ((short)uVar76 >= sVar4) * uVar76;
              sVar4 = auVar46._8_2_;
              auVar72._8_2_ =
                   (ushort)((short)uVar77 < sVar4) * sVar4 | ((short)uVar77 >= sVar4) * uVar77;
              sVar4 = auVar46._10_2_;
              auVar72._10_2_ =
                   (ushort)((short)uVar78 < sVar4) * sVar4 | ((short)uVar78 >= sVar4) * uVar78;
              sVar4 = auVar46._12_2_;
              auVar72._12_2_ =
                   (ushort)((short)uVar79 < sVar4) * sVar4 | ((short)uVar79 >= sVar4) * uVar79;
              sVar4 = auVar46._14_2_;
              auVar72._14_2_ =
                   (ushort)((short)uVar80 < sVar4) * sVar4 | ((short)uVar80 >= sVar4) * uVar80;
              auVar48._0_2_ = -(ushort)(in_XMM13._0_2_ == -1);
              auVar48._2_2_ = -(ushort)(in_XMM13._2_2_ == -1);
              auVar48._4_2_ = -(ushort)(in_XMM13._4_2_ == -1);
              auVar48._6_2_ = -(ushort)(in_XMM13._6_2_ == -1);
              auVar48._8_2_ = -(ushort)(in_XMM13._8_2_ == -1);
              auVar48._10_2_ = -(ushort)(in_XMM13._10_2_ == -1);
              auVar48._12_2_ = -(ushort)(in_XMM13._12_2_ == -1);
              auVar48._14_2_ = -(ushort)(in_XMM13._14_2_ == -1);
              auVar73 = pblendvb(auVar72,local_148,auVar48);
              auVar88._4_2_ = local_178;
              auVar88._0_4_ = uVar54;
              auVar88._6_2_ = sStack_176;
              auVar88._8_2_ = local_178;
              auVar88._10_2_ = sStack_176;
              auVar88._12_2_ = local_178;
              auVar88._14_2_ = sStack_176;
              auVar70 = pblendvb(auVar85,auVar88,auVar48);
              auVar88 = pblendvb(auVar87,auVar88,auVar48);
              sVar4 = auVar73._0_2_;
              sVar82 = auVar73._2_2_;
              sVar86 = auVar73._4_2_;
              sVar5 = auVar73._6_2_;
              sVar6 = auVar73._8_2_;
              sVar7 = auVar73._10_2_;
              sVar8 = auVar73._12_2_;
              sVar9 = auVar73._14_2_;
              auVar46 = auVar49;
              if (7 < uVar24) {
                uVar59 = (ushort)(sVar4 < (short)uVar59) * sVar4 | (sVar4 >= (short)uVar59) * uVar59
                ;
                uVar60 = (ushort)(sVar82 < (short)uVar60) * sVar82 |
                         (sVar82 >= (short)uVar60) * uVar60;
                uVar61 = (ushort)(sVar86 < (short)uVar61) * sVar86 |
                         (sVar86 >= (short)uVar61) * uVar61;
                uVar62 = (ushort)(sVar5 < (short)uVar62) * sVar5 | (sVar5 >= (short)uVar62) * uVar62
                ;
                uVar63 = (ushort)(sVar6 < (short)uVar63) * sVar6 | (sVar6 >= (short)uVar63) * uVar63
                ;
                uVar64 = (ushort)(sVar7 < (short)uVar64) * sVar7 | (sVar7 >= (short)uVar64) * uVar64
                ;
                uVar65 = (ushort)(sVar8 < (short)uVar65) * sVar8 | (sVar8 >= (short)uVar65) * uVar65
                ;
                uVar66 = (ushort)(sVar9 < (short)uVar66) * sVar9 | (sVar9 >= (short)uVar66) * uVar66
                ;
                sVar53 = auVar49._0_2_;
                auVar46._0_2_ =
                     (ushort)(sVar53 < sVar4) * sVar4 | (ushort)(sVar53 >= sVar4) * sVar53;
                sVar53 = auVar49._2_2_;
                auVar46._2_2_ =
                     (ushort)(sVar53 < sVar82) * sVar82 | (ushort)(sVar53 >= sVar82) * sVar53;
                sVar53 = auVar49._4_2_;
                auVar46._4_2_ =
                     (ushort)(sVar53 < sVar86) * sVar86 | (ushort)(sVar53 >= sVar86) * sVar53;
                sVar53 = auVar49._6_2_;
                auVar46._6_2_ =
                     (ushort)(sVar53 < sVar5) * sVar5 | (ushort)(sVar53 >= sVar5) * sVar53;
                sVar53 = auVar49._8_2_;
                auVar46._8_2_ =
                     (ushort)(sVar53 < sVar6) * sVar6 | (ushort)(sVar53 >= sVar6) * sVar53;
                sVar53 = auVar49._10_2_;
                auVar46._10_2_ =
                     (ushort)(sVar53 < sVar7) * sVar7 | (ushort)(sVar53 >= sVar7) * sVar53;
                sVar53 = auVar49._12_2_;
                sVar58 = auVar49._14_2_;
                auVar46._12_2_ =
                     (ushort)(sVar53 < sVar8) * sVar8 | (ushort)(sVar53 >= sVar8) * sVar53;
                auVar46._14_2_ =
                     (ushort)(sVar58 < sVar9) * sVar9 | (ushort)(sVar58 >= sVar9) * sVar58;
              }
              piVar3 = ((ppVar16->field_4).rowcols)->score_row;
              if (uVar24 < uVar42) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_108) = (int)sVar9;
              }
              if (uVar24 - 1 < uVar42 && uVar18 < uVar43) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_100) = (int)sVar8;
              }
              if ((uVar31 < uVar43) && ((long)(uVar24 - 2) < (long)uVar42 && 1 < uVar24)) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_128) = (int)sVar7;
              }
              if ((uVar37 < uVar43) && ((long)(uVar24 - 3) < (long)uVar42 && 2 < uVar24)) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_138) = (int)sVar6;
              }
              if ((uVar32 < uVar43) && ((long)(uVar24 - 4) < (long)uVar42 && 3 < uVar24)) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_130) = (int)sVar5;
              }
              if ((uVar33 < uVar43) && ((long)(uVar24 - 5) < (long)uVar42 && 4 < uVar24)) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_120) = (int)sVar86;
              }
              if ((uVar19 < uVar43) && ((long)(uVar24 - 6) < (long)uVar42 && 5 < uVar24)) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_118) = (int)sVar82;
              }
              if ((uVar20 < uVar43) && ((long)(uVar24 - 7) < (long)uVar42 && 6 < uVar24)) {
                *(int *)((long)piVar3 + uVar24 * 4 + local_110) = (int)sVar4;
              }
              ptr_00[uVar24] = sVar4;
              ptr_01[uVar24] = auVar70._0_2_;
              local_68 = auVar51._0_2_;
              sStack_66 = auVar51._2_2_;
              sStack_64 = auVar51._4_2_;
              sStack_62 = auVar51._6_2_;
              sStack_60 = auVar51._8_2_;
              sStack_5e = auVar51._10_2_;
              sStack_5c = auVar51._12_2_;
              sStack_5a = auVar51._14_2_;
              auVar49._0_2_ = -(ushort)(in_XMM13._0_2_ == local_68);
              auVar49._2_2_ = -(ushort)(in_XMM13._2_2_ == sStack_66);
              auVar49._4_2_ = -(ushort)(in_XMM13._4_2_ == sStack_64);
              auVar49._6_2_ = -(ushort)(in_XMM13._6_2_ == sStack_62);
              auVar49._8_2_ = -(ushort)(in_XMM13._8_2_ == sStack_60);
              auVar49._10_2_ = -(ushort)(in_XMM13._10_2_ == sStack_5e);
              auVar49._12_2_ = -(ushort)(in_XMM13._12_2_ == sStack_5c);
              auVar49._14_2_ = -(ushort)(in_XMM13._14_2_ == sStack_5a);
              auVar67 = pblendvb(auVar67,auVar73,auVar49 & auVar81);
              in_XMM13 = paddsw(in_XMM13,auVar69);
              uVar24 = uVar24 + 1;
              auVar84 = auVar52;
              auVar49 = auVar46;
            } while (uVar40 != uVar24);
            auVar68 = paddsw(auVar68,_DAT_008d0b90);
            local_148 = psubsw(local_148,auVar50);
            local_108 = local_108 + lVar17;
            local_100 = local_100 + lVar17;
            local_110 = local_110 + lVar17;
            local_118 = local_118 + lVar17;
            local_120 = local_120 + lVar17;
            local_130 = local_130 + lVar17;
            local_138 = local_138 + lVar17;
            local_128 = local_128 + lVar17;
            uVar24 = uVar1;
          } while (uVar1 < uVar43);
        }
        iVar15 = 8;
        do {
          uVar43 = auVar67._0_8_;
          lVar17 = auVar67._8_8_;
          uVar29 = (uint)auVar67._14_2_;
          if ((short)auVar67._14_2_ <= (short)uVar38) {
            uVar29 = uVar38;
          }
          uVar38 = uVar29;
          sVar21 = (short)uVar38;
          auVar67._0_8_ = uVar43 << 0x10;
          auVar67._8_8_ = lVar17 << 0x10 | uVar43 >> 0x30;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        auVar69._0_2_ = -(ushort)((short)uVar59 < local_178);
        auVar69._2_2_ = -(ushort)((short)uVar60 < sStack_176);
        auVar69._4_2_ = -(ushort)((short)uVar61 < local_178);
        auVar69._6_2_ = -(ushort)((short)uVar62 < sStack_176);
        auVar69._8_2_ = -(ushort)((short)uVar63 < local_178);
        auVar69._10_2_ = -(ushort)((short)uVar64 < sStack_176);
        auVar69._12_2_ = -(ushort)((short)uVar65 < local_178);
        auVar69._14_2_ = -(ushort)((short)uVar66 < sStack_176);
        auVar57._0_2_ = -(ushort)((short)local_e8 < auVar46._0_2_);
        auVar57._2_2_ = -(ushort)((short)uStack_e6 < auVar46._2_2_);
        auVar57._4_2_ = -(ushort)((short)local_e8 < auVar46._4_2_);
        auVar57._6_2_ = -(ushort)((short)uStack_e6 < auVar46._6_2_);
        auVar57._8_2_ = -(ushort)((short)local_e8 < auVar46._8_2_);
        auVar57._10_2_ = -(ushort)((short)uStack_e6 < auVar46._10_2_);
        auVar57._12_2_ = -(ushort)((short)local_e8 < auVar46._12_2_);
        auVar57._14_2_ = -(ushort)((short)uStack_e6 < auVar46._14_2_);
        auVar57 = auVar57 | auVar69;
        if ((((((((((((((((auVar57 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar57 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar57 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar57 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar57 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar57 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar57 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar57 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar57 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar57 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar57 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar57 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar57 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar57 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar57 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar57[0xf] < '\0') {
          *(byte *)&ppVar16->flag = (byte)ppVar16->flag | 0x40;
          sVar21 = 0;
          iVar23 = 0;
          uVar27 = 0;
        }
        ppVar16->score = (int)sVar21;
        ppVar16->end_query = uVar27;
        ppVar16->end_ref = iVar23;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_188);
          return ppVar16;
        }
        return ppVar16;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMax;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMax = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, -open - i*gap, 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi16(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMax = _mm_blendv_epi8(vMax, vWH, cond_all);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* max in vMax */
    for (i=0; i<N; ++i) {
        int16_t value;
        value = (int16_t) _mm_extract_epi16(vMax, 7);
        if (value > score) {
            score = value;
        }
        vMax = _mm_slli_si128(vMax, 2);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}